

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::CreateLinkScript
          (cmMakefileTargetGenerator *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *link_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_commands,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  ostream *poVar1;
  char *pcVar2;
  pointer pbVar3;
  allocator local_321;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_320;
  string linkScriptName;
  string link_command;
  string local_2d8;
  string local_2b8;
  string local_298;
  cmGeneratedFileStream linkScriptStream;
  
  local_320 = makefile_depends;
  std::__cxx11::string::string((string *)&linkScriptName,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::append((char *)&linkScriptName);
  std::__cxx11::string::append((char *)&linkScriptName);
  cmGeneratedFileStream::cmGeneratedFileStream
            (&linkScriptStream,linkScriptName._M_dataplus._M_p,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&linkScriptStream,true);
  for (pbVar3 = (link_commands->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != (link_commands->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    if ((pbVar3->_M_string_length != 0) && (*(pbVar3->_M_dataplus)._M_p != ':')) {
      poVar1 = std::operator<<((ostream *)&linkScriptStream,(string *)pbVar3);
      std::operator<<(poVar1,"\n");
    }
  }
  std::__cxx11::string::string
            ((string *)&link_command,"$(CMAKE_COMMAND) -E cmake_link_script ",
             (allocator *)&local_2d8);
  this_00 = this->LocalGenerator;
  pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this_00);
  std::__cxx11::string::string((string *)&local_2b8,pcVar2,&local_321);
  cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
            (&local_298,this_00,&local_2b8,&linkScriptName);
  cmOutputConverter::ConvertToOutputFormat
            (&local_2d8,
             &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter
             ,&local_298,SHELL);
  std::__cxx11::string::append((string *)&link_command);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::append((char *)&link_command);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(makefile_commands,&link_command);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_320,&linkScriptName);
  std::__cxx11::string::~string((string *)&link_command);
  cmGeneratedFileStream::~cmGeneratedFileStream(&linkScriptStream);
  std::__cxx11::string::~string((string *)&linkScriptName);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkScript(
  const char* name, std::vector<std::string> const& link_commands,
  std::vector<std::string>& makefile_commands,
  std::vector<std::string>& makefile_depends)
{
  // Create the link script file.
  std::string linkScriptName = this->TargetBuildDirectoryFull;
  linkScriptName += "/";
  linkScriptName += name;
  cmGeneratedFileStream linkScriptStream(linkScriptName.c_str());
  linkScriptStream.SetCopyIfDifferent(true);
  for (std::vector<std::string>::const_iterator cmd = link_commands.begin();
       cmd != link_commands.end(); ++cmd) {
    // Do not write out empty commands or commands beginning in the
    // shell no-op ":".
    if (!cmd->empty() && (*cmd)[0] != ':') {
      linkScriptStream << *cmd << "\n";
    }
  }

  // Create the makefile command to invoke the link script.
  std::string link_command = "$(CMAKE_COMMAND) -E cmake_link_script ";
  link_command += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), linkScriptName),
    cmOutputConverter::SHELL);
  link_command += " --verbose=$(VERBOSE)";
  makefile_commands.push_back(link_command);
  makefile_depends.push_back(linkScriptName);
}